

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hh
# Opt level: O0

fixed_depth_iterator * __thiscall
tree<libDAI::BoundTreeNode,std::allocator<tree_node_<libDAI::BoundTreeNode>>>::
append_child<tree<libDAI::BoundTreeNode,std::allocator<tree_node_<libDAI::BoundTreeNode>>>::fixed_depth_iterator>
          (tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_> *this,
          fixed_depth_iterator *position,BoundTreeNode *x)

{
  tree_node_<libDAI::BoundTreeNode> *ptVar1;
  BoundTreeNode *in_RCX;
  new_allocator<tree_node_<libDAI::BoundTreeNode>_> *in_RDX;
  fixed_depth_iterator *in_RDI;
  tree_node *tmp;
  tree_node *in_stack_ffffffffffffffb8;
  fixed_depth_iterator *pfVar2;
  
  pfVar2 = in_RDI;
  ptVar1 = __gnu_cxx::new_allocator<tree_node_<libDAI::BoundTreeNode>_>::allocate
                     (in_RDX,(size_type)in_RDI,in_RDI);
  kp::constructor<libDAI::BoundTreeNode,libDAI::BoundTreeNode_const>(&ptVar1->data,in_RCX);
  ptVar1->first_child = (tree_node_<libDAI::BoundTreeNode> *)0x0;
  ptVar1->last_child = (tree_node_<libDAI::BoundTreeNode> *)0x0;
  ptVar1->parent = *(tree_node_<libDAI::BoundTreeNode> **)in_RDX;
  if (*(long *)(*(long *)in_RDX + 0x10) == 0) {
    *(tree_node_<libDAI::BoundTreeNode> **)(*(long *)in_RDX + 8) = ptVar1;
  }
  else {
    *(tree_node_<libDAI::BoundTreeNode> **)(*(long *)(*(long *)in_RDX + 0x10) + 0x20) = ptVar1;
  }
  ptVar1->prev_sibling = *(tree_node_<libDAI::BoundTreeNode> **)(*(long *)in_RDX + 0x10);
  *(tree_node_<libDAI::BoundTreeNode> **)(*(long *)in_RDX + 0x10) = ptVar1;
  ptVar1->next_sibling = (tree_node_<libDAI::BoundTreeNode> *)0x0;
  tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
  fixed_depth_iterator::fixed_depth_iterator(in_RDI,in_stack_ffffffffffffffb8);
  return pfVar2;
}

Assistant:

iter tree<T, tree_node_allocator>::append_child(iter position, const T& x)
   {
   // If your program fails here you probably used 'append_child' to add the top
   // node to an empty tree. From version 1.45 the top element should be added
   // using 'insert'. See the documentation for further information, and sorry about
   // the API change.
   assert(position.node!=head);
   assert(position.node);

   tree_node* tmp = alloc_.allocate(1,0);
   kp::constructor(&tmp->data, x);
   tmp->first_child=0;
   tmp->last_child=0;

   tmp->parent=position.node;
   if(position.node->last_child!=0) {
      position.node->last_child->next_sibling=tmp;
      }
   else {
      position.node->first_child=tmp;
      }
   tmp->prev_sibling=position.node->last_child;
   position.node->last_child=tmp;
   tmp->next_sibling=0;
   return tmp;
   }